

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pki.cpp
# Opt level: O1

Url * __thiscall Vault::Pki::getUrl(Url *__return_storage_ptr__,Pki *this,Path *path)

{
  long *plVar1;
  size_type sVar2;
  pointer pcVar3;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  
  plVar1 = *(long **)this;
  Vault::operator+(&local_48,"/v1/",
                   (Tiny<Vault::SecretMountDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(this + 8));
  sVar2 = (path->value_)._M_string_length;
  if (sVar2 == 0) {
    local_68 = &local_58;
    pcVar3 = (path->value_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar3,pcVar3);
  }
  else {
    Vault::operator+(&local_88,"/",path);
    local_68 = &local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      local_58._8_8_ = local_88.field_2._8_8_;
    }
    else {
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88._M_dataplus._M_p;
    }
    local_58._M_allocated_capacity._1_7_ = local_88.field_2._M_allocated_capacity._1_7_;
    local_58._M_local_buf[0] = local_88.field_2._M_local_buf[0];
    local_60 = local_88._M_string_length;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,&local_48,&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58._M_allocated_capacity + 1);
  }
  if ((sVar2 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Pki::getUrl(const Path &path) const {
  return client_.getUrl("/v1/" + secretMount_,
                        path.empty() ? path : Path{"/" + path});
}